

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.h
# Opt level: O2

ImmutableFieldGenerator * __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          FieldDescriptor *field)

{
  LogMessage *other;
  char *pcVar1;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  ImmutableFieldGenerator *pIVar2;
  int in_EDX;
  int extraout_EDX;
  LogFinisher local_51;
  LogMessage local_50;
  
  other = (LogMessage *)field;
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
               ,0x98);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    in_EDX = extraout_EDX;
  }
  pcVar1 = FieldDescriptor::index(field,(char *)other,in_EDX);
  this_00 = internal::
            scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
            ::operator[](&this->field_generators_,(long)(int)pcVar1);
  pIVar2 = internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>::
           operator*(this_00);
  return pIVar2;
}

Assistant:

inline const FieldGeneratorType&
FieldGeneratorMap<FieldGeneratorType>::get(const FieldDescriptor* field) const {
  GOOGLE_CHECK_EQ(field->containing_type(), descriptor_);
  return *field_generators_[field->index()];
}